

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

int SaveConfigToStream(TidyDocImpl *doc,StreamOut *out)

{
  TidyOptionValue *val;
  TidyOptionId TVar1;
  TidyOptionType TVar2;
  TidyAllocator *pTVar3;
  _func_void_ptr_TidyAllocator_ptr_size_t *p_Var4;
  Bool BVar5;
  uint uVar6;
  int iVar7;
  tmbstr ptVar8;
  ulong uVar9;
  TidyOptionImpl *option;
  tmbchar local_58 [40];
  
  iVar7 = 0;
  option = option_defs;
  do {
    while( true ) {
      do {
        option = option + 1;
        if (iVar7 != 0) {
          return -1;
        }
        if (option->name == (ctmbstr)0x0) {
          return 0;
        }
        iVar7 = 0;
      } while (option->parser == (ParseProperty *)0x0);
      TVar1 = option->id;
      val = (doc->config).value + TVar1;
      BVar5 = OptionValueEqDefault(option,val);
      if (BVar5 == no) break;
      if (TVar1 == TidyDoctype) {
LAB_00134631:
        uVar9 = (doc->config).value[0xe].v;
        if (uVar9 != 2) {
          if (uVar9 == 5) {
            pTVar3 = doc->allocator;
            p_Var4 = pTVar3->vtbl->alloc;
            uVar6 = prvTidytmbstrlen(val->p);
            ptVar8 = (tmbstr)(*p_Var4)(pTVar3,(long)uVar6 + 2);
            if (ptVar8 != (tmbstr)0x0) {
              ptVar8[0] = '\"';
              ptVar8[1] = '\0';
              prvTidytmbstrcat(ptVar8,val->p);
              prvTidytmbstrcat(ptVar8,"\"");
              WriteOptionString(option,ptVar8,out);
              (*doc->allocator->vtbl->free)(doc->allocator,ptVar8);
            }
          }
          else {
LAB_001346cf:
            iVar7 = WriteOptionPick(option,(uint)uVar9,out);
          }
        }
      }
    }
    if (TVar1 == TidyDoctype) goto LAB_00134631;
    if (option->pickList != (PickListItems *)0x0) {
      uVar9 = (ulong)*(uint *)val;
      goto LAB_001346cf;
    }
    TVar2 = option->type;
    if (TVar2 == TidyBoolean) {
      ptVar8 = "yes";
      if (val->v == 0) {
        ptVar8 = "no";
      }
      goto LAB_0013474f;
    }
    if (TVar2 == TidyInteger) {
      local_58[0x10] = '\0';
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      local_58[0x18] = '\0';
      local_58[0x19] = '\0';
      local_58[0x1a] = '\0';
      local_58[0x1b] = '\0';
      local_58[0x1c] = '\0';
      local_58[0x1d] = '\0';
      local_58[0x1e] = '\0';
      local_58[0x1f] = '\0';
      local_58[0] = '\0';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      ptVar8 = local_58;
      prvTidytmbsnprintf(ptVar8,0x20,"%u",(ulong)*(uint *)val);
      goto LAB_0013474f;
    }
    if (TVar2 == TidyString) {
      ptVar8 = val->p;
LAB_0013474f:
      iVar7 = 0;
      WriteOptionString(option,ptVar8,out);
    }
  } while( true );
}

Assistant:

static int  SaveConfigToStream( TidyDocImpl* doc, StreamOut* out )
{
    int rc = 0;
    const TidyOptionImpl* option;
    for ( option=option_defs+1; 0==rc && option && option->name; ++option )
    {
        const TidyOptionValue* val = &doc->config.value[ option->id ];
        if ( option->parser == NULL )
            continue;
        if ( OptionValueEqDefault( option, val ) && option->id != TidyDoctype)
            continue;

        if ( option->id == TidyDoctype )  /* Special case */
        {
          ulong dtmode = cfg( doc, TidyDoctypeMode );
          if ( dtmode == TidyDoctypeUser )
          {
            tmbstr t;
            
            /* add 2 double quotes */
            if (( t = (tmbstr)TidyDocAlloc( doc, TY_(tmbstrlen)( val->p ) + 2 ) ))
            {
              t[0] = '\"'; t[1] = 0;
            
              TY_(tmbstrcat)( t, val->p );
              TY_(tmbstrcat)( t, "\"" );
              rc = WriteOptionString( option, t, out );
            
              TidyDocFree( doc, t );
            }
          }
          else if ( dtmode == option_defs[TidyDoctypeMode].dflt )
            continue;
          else
            rc = WriteOptionPick( option, dtmode, out );
        }
        else if ( option->pickList)
          rc = WriteOptionPick( option, val->v, out );
        else
        {
          switch ( option->type )
          {
          case TidyString:
            rc = WriteOptionString( option, val->p, out );
            break;
          case TidyInteger:
            rc = WriteOptionInt( option, val->v, out );
            break;
          case TidyBoolean:
            rc = WriteOptionBool( option, val->v ? yes : no, out );
            break;
          }
        }
    }
    return rc;
}